

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O0

void __thiscall
rudp::session::send_packets_internal(session *this,buffers_ptr_t *data,send_cb_t *cb)

{
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  *this_00;
  vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
  *pvVar1;
  __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *p_Var2;
  vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  *pvVar3;
  uchar *data_00;
  size_type size_in_bytes;
  anon_class_72_4_ff401564 local_78;
  mutable_buffer local_30;
  send_cb_t *local_20;
  send_cb_t *cb_local;
  buffers_ptr_t *data_local;
  session *this_local;
  
  this_00 = (basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
             *)this->socket;
  local_20 = cb;
  cb_local = (send_cb_t *)data;
  data_local = (buffers_ptr_t *)this;
  pvVar1 = &std::
            __shared_ptr_access<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)data)->
            super_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
  ;
  p_Var2 = (__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)boost::container::
              vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
              ::back(pvVar1);
  pvVar3 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(p_Var2)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  data_00 = boost::container::
            vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ::data(pvVar3);
  pvVar1 = &std::
            __shared_ptr_access<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)cb_local)->
            super_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
  ;
  p_Var2 = (__shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            *)boost::container::
              vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_boost::container::dtl::static_storage_allocator<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_0UL,_true>,_void>
              ::back(pvVar1);
  pvVar3 = &std::
            __shared_ptr_access<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->(p_Var2)->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
  ;
  size_in_bytes =
       boost::container::
       vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
       ::size(pvVar3);
  local_30 = (mutable_buffer)boost::asio::buffer(data_00,size_in_bytes);
  local_78.this = this;
  std::enable_shared_from_this<rudp::session>::shared_from_this
            ((enable_shared_from_this<rudp::session> *)&local_78.this_);
  std::
  shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
  ::shared_ptr(&local_78.data,
               (shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_256UL,_void>_>
                *)cb_local);
  std::function<void_(bool)>::function(&local_78.cb,local_20);
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::
  async_send_to<boost::asio::mutable_buffers_1,rudp::session::send_packets_internal(std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&,std::function<void(bool)>const&)::__0>
            (this_00,(mutable_buffers_1 *)&local_30,&this->endpoint,&local_78);
  send_packets_internal(std::shared_ptr<boost::container::static_vector<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,256ul,void>>const&,std::function<void(bool)>const&)
  ::$_0::~__0((__0 *)&local_78);
  return;
}

Assistant:

void session::send_packets_internal(
    const buffers_ptr_t &data,
    const send_cb_t &cb
  ) {
    socket.async_send_to( boost::asio::buffer( data->back()->data(), data->back()->size() ),
      endpoint,
      [this,this_=shared_from_this(),data,cb]( const boost::system::error_code &error, size_t ) {
        if( !error ) {
	         data->pop_back();
	         if( data->empty() );
	         else send_packets_internal( data, cb );
	       }
	       else {
          cb( false );
        }
      }
    );
  }